

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanced_geometry_device.cpp
# Opt level: O1

void device_init(char *cfg)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_28;
  
  embree::TutorialData_Constructor((TutorialData *)&embree::data);
  embree::g_scene = (RTCScene)rtcNewScene(g_device);
  embree::data = embree::g_scene;
  rtcSetSceneBuildQuality(embree::g_scene,0);
  rtcSetSceneFlags(embree::data,1);
  DAT_002cfd50 = (RTCScene)rtcNewScene(g_device);
  local_28._0_8_ = 0;
  local_28._8_8_ = 0x3f800000;
  embree::createTriangulatedSphere(DAT_002cfd50,(Vec3fa *)&local_28.field_1,0.5);
  local_28._0_8_ = 0x3f800000;
  local_28._8_8_ = 0;
  embree::createTriangulatedSphere(DAT_002cfd50,(Vec3fa *)&local_28.field_1,0.5);
  local_28._0_8_ = 0;
  local_28._8_8_ = 0xbf800000;
  embree::createTriangulatedSphere(DAT_002cfd50,(Vec3fa *)&local_28.field_1,0.5);
  local_28._0_8_ = 0xbf800000;
  local_28._8_8_ = 0;
  embree::createTriangulatedSphere(DAT_002cfd50,(Vec3fa *)&local_28.field_1,0.5);
  rtcCommitScene(DAT_002cfd50);
  embree::g_instance0 = rtcNewGeometry(g_device,0x79);
  rtcSetGeometryMask(embree::g_instance0,0x80);
  rtcSetGeometryInstancedScene(embree::g_instance0,DAT_002cfd50);
  rtcSetGeometryTimeStepCount(embree::g_instance0,1);
  embree::g_instance1 = rtcNewGeometry(g_device,0x79);
  rtcSetGeometryInstancedScene(embree::g_instance1,DAT_002cfd50);
  rtcSetGeometryTimeStepCount(embree::g_instance1,1);
  embree::g_instance2 = rtcNewGeometry(g_device,0x79);
  rtcSetGeometryInstancedScene(embree::g_instance2,DAT_002cfd50);
  rtcSetGeometryTimeStepCount(embree::g_instance2,1);
  embree::g_instance3 = rtcNewGeometry(g_device,0x79);
  rtcSetGeometryInstancedScene(embree::g_instance3,DAT_002cfd50);
  rtcSetGeometryTimeStepCount(embree::g_instance3,1);
  rtcAttachGeometry(embree::data,embree::g_instance0);
  rtcAttachGeometry(embree::data,embree::g_instance1);
  rtcAttachGeometry(embree::data,embree::g_instance2);
  rtcAttachGeometry(embree::data,embree::g_instance3);
  rtcReleaseGeometry(embree::g_instance0);
  rtcReleaseGeometry(embree::g_instance1);
  rtcReleaseGeometry(embree::g_instance2);
  rtcReleaseGeometry(embree::g_instance3);
  embree::createGroundPlane(embree::data);
  puVar1 = DAT_002cfd70;
  *DAT_002cfd70 = 0x3e800000;
  puVar1[1] = 0;
  puVar1 = DAT_002cfd70;
  DAT_002cfd70[2] = 0x3f000000;
  puVar1[3] = 0;
  puVar1 = DAT_002cfd70;
  DAT_002cfd70[4] = 0x3f400000;
  puVar1[5] = 0;
  puVar1 = DAT_002cfd70;
  DAT_002cfd70[6] = 0x3f800000;
  puVar1[7] = 0;
  puVar1[8] = 0x3e80000000000000;
  puVar1[9] = 0;
  puVar1[10] = 0x3f00000000000000;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0x3f40000000000000;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0x3f80000000000000;
  puVar1[0xf] = 0;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0x3e800000;
  puVar1[0x12] = 0;
  puVar1[0x13] = 0x3f000000;
  puVar1[0x14] = 0;
  puVar1[0x15] = 0x3f400000;
  puVar1[0x16] = 0;
  puVar1[0x17] = 0x3f800000;
  puVar1[0x18] = 0x3e8000003e800000;
  puVar1[0x19] = 0;
  puVar1[0x1a] = 0x3f0000003f000000;
  puVar1[0x1b] = 0;
  puVar1[0x1c] = 0x3f4000003f400000;
  puVar1[0x1d] = 0;
  puVar1[0x1e] = 0x3f8000003f800000;
  puVar1[0x1f] = 0;
  return;
}

Assistant:

void device_init (char* cfg)
{
  TutorialData_Constructor(&data);
  
  /* create scene */
  data.g_scene = g_scene = rtcNewScene(g_device);
  rtcSetSceneBuildQuality(data.g_scene,RTC_BUILD_QUALITY_LOW);
  rtcSetSceneFlags(data.g_scene,RTC_SCENE_FLAG_DYNAMIC);

  /* create scene with 4 triangulated spheres */
  data.g_scene1 = rtcNewScene(g_device);
  createTriangulatedSphere(data.g_scene1,Vec3fa( 0, 0,+1),0.5f);
  createTriangulatedSphere(data.g_scene1,Vec3fa(+1, 0, 0),0.5f);
  createTriangulatedSphere(data.g_scene1,Vec3fa( 0, 0,-1),0.5f);
  createTriangulatedSphere(data.g_scene1,Vec3fa(-1, 0, 0),0.5f);
  rtcCommitScene (data.g_scene1);

  /* instantiate geometry */
  g_instance0 = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryMask(g_instance0, 0x80); // test high instance mask bits
  rtcSetGeometryInstancedScene(g_instance0,data.g_scene1);
  rtcSetGeometryTimeStepCount(g_instance0,1);
  g_instance1 = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryInstancedScene(g_instance1,data.g_scene1);
  rtcSetGeometryTimeStepCount(g_instance1,1);
  g_instance2 = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryInstancedScene(g_instance2,data.g_scene1);
  rtcSetGeometryTimeStepCount(g_instance2,1);
  g_instance3 = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryInstancedScene(g_instance3,data.g_scene1);
  rtcSetGeometryTimeStepCount(g_instance3,1);
  rtcAttachGeometry(data.g_scene,g_instance0);
  rtcAttachGeometry(data.g_scene,g_instance1);
  rtcAttachGeometry(data.g_scene,g_instance2);
  rtcAttachGeometry(data.g_scene,g_instance3);
  rtcReleaseGeometry(g_instance0);
  rtcReleaseGeometry(g_instance1);
  rtcReleaseGeometry(g_instance2);
  rtcReleaseGeometry(g_instance3);
  createGroundPlane(data.g_scene);

  /* set all colors */
  data.colors[4*0+0] = Vec3fa(0.25f, 0.f, 0.f);
  data.colors[4*0+1] = Vec3fa(0.50f, 0.f, 0.f);
  data.colors[4*0+2] = Vec3fa(0.75f, 0.f, 0.f);
  data.colors[4*0+3] = Vec3fa(1.00f, 0.f, 0.f);

  data.colors[4*1+0] = Vec3fa(0.f, 0.25f, 0.f);
  data.colors[4*1+1] = Vec3fa(0.f, 0.50f, 0.f);
  data.colors[4*1+2] = Vec3fa(0.f, 0.75f, 0.f);
  data.colors[4*1+3] = Vec3fa(0.f, 1.00f, 0.f);

  data.colors[4*2+0] = Vec3fa(0.f, 0.f, 0.25f);
  data.colors[4*2+1] = Vec3fa(0.f, 0.f, 0.50f);
  data.colors[4*2+2] = Vec3fa(0.f, 0.f, 0.75f);
  data.colors[4*2+3] = Vec3fa(0.f, 0.f, 1.00f);

  data.colors[4*3+0] = Vec3fa(0.25f, 0.25f, 0.f);
  data.colors[4*3+1] = Vec3fa(0.50f, 0.50f, 0.f);
  data.colors[4*3+2] = Vec3fa(0.75f, 0.75f, 0.f);
  data.colors[4*3+3] = Vec3fa(1.00f, 1.00f, 0.f);
}